

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

BOOL __thiscall
Js::TypedArrayBase::GetDiagTypeString
          (TypedArrayBase *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16_t *pcVar4;
  
  switch(((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.type.ptr)->typeId) {
  case TypeIds_Int8Array:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<20ul>
              (stringBuilder,(char16 (*) [20])L"Object, (Int8Array)");
    break;
  case TypeIds_Uint8Array:
    pcVar4 = L"Object, (Uint8Array)";
    goto LAB_00d5d98f;
  case TypeIds_Uint8ClampedArray:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<28ul>
              (stringBuilder,(char16 (*) [28])L"Object, (Uint8ClampedArray)");
    break;
  case TypeIds_Int16Array:
    pcVar4 = L"Object, (Int16Array)";
    goto LAB_00d5d98f;
  case TypeIds_Uint16Array:
    pcVar4 = L"Object, (Uint16Array)";
    goto LAB_00d5d9a3;
  case TypeIds_Int32Array:
    pcVar4 = L"Object, (Int32Array)";
LAB_00d5d98f:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<21ul>
              (stringBuilder,(char16 (*) [21])pcVar4);
    break;
  case TypeIds_Uint32Array:
    pcVar4 = L"Object, (Uint32Array)";
LAB_00d5d9a3:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<22ul>
              (stringBuilder,(char16 (*) [22])pcVar4);
    break;
  case TypeIds_Float32Array:
    pcVar4 = L"Object, (Float32Array)";
    goto LAB_00d5d9b4;
  case TypeIds_Float64Array:
    pcVar4 = L"Object, (Float64Array)";
LAB_00d5d9b4:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<23ul>
              (stringBuilder,(char16 (*) [23])pcVar4);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x91d,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<7ul>
              (stringBuilder,(char16 (*) [7])0x11b672e);
  }
  return 1;
}

Assistant:

BOOL TypedArrayBase::GetDiagTypeString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        switch(GetTypeId())
        {
        case TypeIds_Int8Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Int8Array)"));
            break;

        case TypeIds_Uint8Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Uint8Array)"));
            break;

        case TypeIds_Uint8ClampedArray:
            stringBuilder->AppendCppLiteral(_u("Object, (Uint8ClampedArray)"));
            break;

        case TypeIds_Int16Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Int16Array)"));
            break;

        case TypeIds_Uint16Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Uint16Array)"));
            break;

        case TypeIds_Int32Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Int32Array)"));
            break;

        case TypeIds_Uint32Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Uint32Array)"));
            break;

        case TypeIds_Float32Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Float32Array)"));
            break;

        case TypeIds_Float64Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Float64Array)"));
            break;

        default:
            Assert(false);
            stringBuilder->AppendCppLiteral(_u("Object"));
            break;
        }

        return TRUE;
    }